

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int get_est_rate_dist(TileDataEnc *tile_data,BLOCK_SIZE bsize,int64_t sse,int *est_residue_cost,
                     int64_t *est_dist)

{
  double dVar1;
  double dVar2;
  int *piVar3;
  int *in_RCX;
  long in_RDX;
  byte in_SIL;
  long in_RDI;
  long *in_R8;
  double est_residue_cost_dbl;
  double est_ld;
  InterModeRdModel *md;
  int local_50;
  int local_4;
  
  piVar3 = (int *)(in_RDI + 0x5338 + (ulong)in_SIL * 0x70);
  if (*piVar3 == 0) {
    local_4 = 0;
  }
  else {
    if (*(double *)(piVar3 + 6) <= (double)in_RDX) {
      dVar1 = round(*(double *)(piVar3 + 6));
      *in_R8 = (long)dVar1;
      dVar1 = *(double *)(piVar3 + 2) * (double)in_RDX + *(double *)(piVar3 + 4);
      if (0.01 <= ABS(dVar1)) {
        dVar1 = ((double)in_RDX - *(double *)(piVar3 + 6)) / dVar1;
        if (0.0 <= dVar1) {
          dVar2 = round(dVar1);
          if ((long)dVar2 < 0x3fffffff) {
            dVar1 = round(dVar1);
            local_50 = (int)(long)dVar1;
          }
          else {
            local_50 = 0x3fffffff;
          }
          *in_RCX = local_50;
        }
        else {
          *in_RCX = 0;
        }
      }
      else {
        *in_RCX = 0x3fffffff;
      }
      if (*in_RCX < 1) {
        *in_RCX = 0;
        *in_R8 = in_RDX;
      }
    }
    else {
      *in_RCX = 0;
      *in_R8 = in_RDX;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int get_est_rate_dist(const TileDataEnc *tile_data, BLOCK_SIZE bsize,
                             int64_t sse, int *est_residue_cost,
                             int64_t *est_dist) {
  const InterModeRdModel *md = &tile_data->inter_mode_rd_models[bsize];
  if (md->ready) {
    if (sse < md->dist_mean) {
      *est_residue_cost = 0;
      *est_dist = sse;
    } else {
      *est_dist = (int64_t)round(md->dist_mean);
      const double est_ld = md->a * sse + md->b;
      // Clamp estimated rate cost by INT_MAX / 2.
      // TODO(angiebird@google.com): find better solution than clamping.
      if (fabs(est_ld) < 1e-2) {
        *est_residue_cost = INT_MAX / 2;
      } else {
        double est_residue_cost_dbl = ((sse - md->dist_mean) / est_ld);
        if (est_residue_cost_dbl < 0) {
          *est_residue_cost = 0;
        } else {
          *est_residue_cost =
              (int)AOMMIN((int64_t)round(est_residue_cost_dbl), INT_MAX / 2);
        }
      }
      if (*est_residue_cost <= 0) {
        *est_residue_cost = 0;
        *est_dist = sse;
      }
    }
    return 1;
  }
  return 0;
}